

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

State * __thiscall re2::DFA::RunStateOnByte(DFA *this,State *state,int c)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  ostream *poVar5;
  DFA *this_00;
  State *pSVar6;
  int in_EDX;
  ulong in_RSI;
  long in_RDI;
  uint32_t flag;
  bool ismatch;
  bool isword;
  bool islastword;
  uint32_t afterflag;
  uint32_t oldbeforeflag;
  uint32_t beforeflag;
  uint32_t needflag;
  State *ns;
  Workq *in_stack_fffffffffffffae0;
  memory_order __m;
  undefined4 in_stack_fffffffffffffae8;
  uint in_stack_fffffffffffffaec;
  uint32_t flag_00;
  LogMessage *in_stack_fffffffffffffaf0;
  Workq *in_stack_fffffffffffffaf8;
  LogMessage *pLVar7;
  DFA *in_stack_fffffffffffffb00;
  undefined8 in_stack_fffffffffffffb10;
  int line;
  char *in_stack_fffffffffffffb18;
  LogMessage *in_stack_fffffffffffffb20;
  uint local_4c0;
  uint32_t in_stack_fffffffffffffb94;
  Workq *in_stack_fffffffffffffb98;
  Workq *in_stack_fffffffffffffba0;
  DFA *in_stack_fffffffffffffba8;
  bool *in_stack_fffffffffffffcc0;
  uint32_t in_stack_fffffffffffffcc8;
  int in_stack_fffffffffffffccc;
  Workq *in_stack_fffffffffffffcd0;
  Workq *in_stack_fffffffffffffcd8;
  DFA *in_stack_fffffffffffffce0;
  LogMessage local_1a0;
  int local_1c;
  ulong local_18;
  __pointer_type local_8;
  
  if (in_RSI < 3) {
    if (in_RSI == 2) {
      local_8 = (__pointer_type)0x2;
    }
    else {
      line = (int)((ulong)in_stack_fffffffffffffb10 >> 0x20);
      if (in_RSI == 1) {
        pLVar7 = &local_1a0;
        LogMessage::LogMessage(in_stack_fffffffffffffb20,&pLVar7->flushed_,line);
        poVar5 = LogMessage::stream(pLVar7);
        std::operator<<(poVar5,"DeadState in RunStateOnByte");
        LogMessage::~LogMessage(in_stack_fffffffffffffaf0);
        local_8 = (__pointer_type)0x0;
      }
      else if (in_RSI == 0) {
        LogMessage::LogMessage(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,line);
        poVar5 = LogMessage::stream((LogMessage *)&stack0xfffffffffffffcd0);
        std::operator<<(poVar5,"NULL state in RunStateOnByte");
        LogMessage::~LogMessage(in_stack_fffffffffffffaf0);
        local_8 = (__pointer_type)0x0;
      }
      else {
        pLVar7 = (LogMessage *)&stack0xfffffffffffffb50;
        LogMessage::LogMessage(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,line);
        poVar5 = LogMessage::stream(pLVar7);
        std::operator<<(poVar5,"Unexpected special state in RunStateOnByte");
        LogMessage::~LogMessage(in_stack_fffffffffffffaf0);
        local_8 = (__pointer_type)0x0;
      }
    }
  }
  else {
    this_00 = (DFA *)(in_RSI + 0x10);
    local_1c = in_EDX;
    local_18 = in_RSI;
    ByteMap((DFA *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
            (int)((ulong)in_stack_fffffffffffffae0 >> 0x20));
    local_8 = std::atomic<re2::DFA::State_*>::load
                        ((atomic<re2::DFA::State_*> *)
                         CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                         (memory_order)((ulong)in_stack_fffffffffffffae0 >> 0x20));
    if (local_8 == (__pointer_type)0x0) {
      StateToWorkq(this_00,(State *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                   in_stack_fffffffffffffae0);
      uVar1 = *(uint *)(local_18 + 0xc);
      uVar4 = *(uint *)(local_18 + 0xc) & 0xff;
      local_4c0 = uVar4;
      if (local_1c == 10) {
        local_4c0 = uVar4 | 2;
      }
      if (local_1c == 0x100) {
        local_4c0 = local_4c0 | 10;
      }
      uVar2 = *(uint *)(local_18 + 0xc);
      flag_00 = in_stack_fffffffffffffaec & 0xffffff;
      if (local_1c != 0x100) {
        bVar3 = Prog::IsWordChar((uint8_t)local_1c);
        flag_00 = CONCAT13(bVar3,(int3)flag_00);
      }
      if (SUB41(flag_00 >> 0x18,0) == ((uVar2 & 0x200) != 0)) {
        local_4c0 = local_4c0 | 0x20;
      }
      else {
        local_4c0 = local_4c0 | 0x10;
      }
      if ((local_4c0 & (uVar4 ^ 0xffffffff) & uVar1 >> 0x10) != 0) {
        RunWorkqOnEmptyString
                  (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,(Workq *)this_00,flag_00);
        std::swap<re2::DFA::Workq*>((Workq **)(in_RDI + 0x48),(Workq **)(in_RDI + 0x50));
      }
      RunWorkqOnByte(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
                     in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
      std::swap<re2::DFA::Workq*>((Workq **)(in_RDI + 0x48),(Workq **)(in_RDI + 0x50));
      pSVar6 = WorkqToCachedState(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
                                  in_stack_fffffffffffffb98,in_stack_fffffffffffffb94);
      __m = (memory_order)(local_18 + 0x10 >> 0x20);
      ByteMap((DFA *)CONCAT44(flag_00,in_stack_fffffffffffffae8),__m);
      std::atomic<re2::DFA::State_*>::store
                ((atomic<re2::DFA::State_*> *)this_00,
                 (__pointer_type)CONCAT44(flag_00,in_stack_fffffffffffffae8),__m);
      local_8 = pSVar6;
    }
  }
  return local_8;
}

Assistant:

DFA::State* DFA::RunStateOnByte(State* state, int c) {
  //mutex_.AssertHeld();

  if (state <= SpecialStateMax) {
    if (state == FullMatchState) {
      // It is convenient for routines like PossibleMatchRange
      // if we implement RunStateOnByte for FullMatchState:
      // once you get into this state you never get out,
      // so it's pretty easy.
      return FullMatchState;
    }
    if (state == DeadState) {
      LOG(DFATAL) << "DeadState in RunStateOnByte";
      return NULL;
    }
    if (state == NULL) {
      LOG(DFATAL) << "NULL state in RunStateOnByte";
      return NULL;
    }
    LOG(DFATAL) << "Unexpected special state in RunStateOnByte";
    return NULL;
  }

  // If someone else already computed this, return it.
  State* ns = state->next_[ByteMap(c)].load(std::memory_order_relaxed);
  if (ns != NULL)
    return ns;

  // Convert state into Workq.
  StateToWorkq(state, q0_);

  // Flags marking the kinds of empty-width things (^ $ etc)
  // around this byte.  Before the byte we have the flags recorded
  // in the State structure itself.  After the byte we have
  // nothing yet (but that will change: read on).
  uint32_t needflag = state->flag_ >> kFlagNeedShift;
  uint32_t beforeflag = state->flag_ & kFlagEmptyMask;
  uint32_t oldbeforeflag = beforeflag;
  uint32_t afterflag = 0;

  if (c == '\n') {
    // Insert implicit $ and ^ around \n
    beforeflag |= kEmptyEndLine;
    afterflag |= kEmptyBeginLine;
  }

  if (c == kByteEndText) {
    // Insert implicit $ and \z before the fake "end text" byte.
    beforeflag |= kEmptyEndLine | kEmptyEndText;
  }

  // The state flag kFlagLastWord says whether the last
  // byte processed was a word character.  Use that info to
  // insert empty-width (non-)word boundaries.
  bool islastword = (state->flag_ & kFlagLastWord) != 0;
  bool isword = c != kByteEndText && Prog::IsWordChar(static_cast<uint8_t>(c));
  if (isword == islastword)
    beforeflag |= kEmptyNonWordBoundary;
  else
    beforeflag |= kEmptyWordBoundary;

  // Okay, finally ready to run.
  // Only useful to rerun on empty string if there are new, useful flags.
  if (beforeflag & ~oldbeforeflag & needflag) {
    RunWorkqOnEmptyString(q0_, q1_, beforeflag);
    using std::swap;
    swap(q0_, q1_);
  }
  bool ismatch = false;
  RunWorkqOnByte(q0_, q1_, c, afterflag, &ismatch);
  using std::swap;
  swap(q0_, q1_);

  // Save afterflag along with ismatch and isword in new state.
  uint32_t flag = afterflag;
  if (ismatch)
    flag |= kFlagMatch;
  if (isword)
    flag |= kFlagLastWord;

  if (ismatch && kind_ == Prog::kManyMatch)
    ns = WorkqToCachedState(q0_, q1_, flag);
  else
    ns = WorkqToCachedState(q0_, NULL, flag);

  // Flush ns before linking to it.
  // Write barrier before updating state->next_ so that the
  // main search loop can proceed without any locking, for speed.
  // (Otherwise it would need one mutex operation per input byte.)
  state->next_[ByteMap(c)].store(ns, std::memory_order_release);
  return ns;
}